

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEnginePrivate::initializeRasterizer(QRasterPaintEnginePrivate *this,QSpanData *data)

{
  QRect *this_00;
  QRasterPaintEngineState *atopLeft;
  QRasterizer *pQVar1;
  QClipData *pQVar2;
  void *in_RSI;
  QRasterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QClipData *c;
  ProcessSpans blend;
  QRasterPaintEngineState *s;
  QRasterPaintEngine *q;
  QRect r;
  QRect clipRect;
  QRect *in_stack_ffffffffffffff78;
  QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_> *this_01;
  QRasterPaintEnginePrivate *in_stack_ffffffffffffff88;
  QSize *asize;
  ProcessSpans blend_00;
  QRect local_48 [3];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)q_func(in_RDI);
  atopLeft = QRasterPaintEngine::state((QRasterPaintEngine *)0x5661e4);
  pQVar1 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                     (&in_RDI->rasterizer);
  QRasterizer::setAntialiased(pQVar1,(*(ushort *)&atopLeft->field_12 >> 3 & 1) != 0);
  local_18.x1.m_i = (in_RDI->deviceRect).x1.m_i;
  local_18.y1.m_i = (in_RDI->deviceRect).y1.m_i;
  local_18.x2.m_i = (in_RDI->deviceRect).x2.m_i;
  local_18.y2.m_i = (in_RDI->deviceRect).y2.m_i;
  asize = (QSize *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = clip(in_stack_ffffffffffffff88);
  if (pQVar2 == (QClipData *)0x0) {
    blend_00 = *(ProcessSpans *)((long)in_RSI + 0x10);
  }
  else {
    QPoint::QPoint((QPoint *)in_RDI,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   (int)in_stack_ffffffffffffff78);
    QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (int)in_stack_ffffffffffffff78);
    QRect::QRect(this_00,(QPoint *)atopLeft,asize);
    QVar3 = QRect::intersected((QRect *)in_RDI,in_stack_ffffffffffffff78);
    local_48[0]._0_8_ = QVar3._0_8_;
    local_18.x1.m_i = local_48[0].x1.m_i;
    local_18.y1.m_i = local_48[0].y1.m_i;
    local_48[0]._8_8_ = QVar3._8_8_;
    local_18.x2.m_i = local_48[0].x2.m_i;
    local_18.y2.m_i = local_48[0].y2.m_i;
    blend_00 = *(ProcessSpans *)((long)in_RSI + 8);
  }
  this_01 = &in_RDI->rasterizer;
  pQVar1 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->(this_01);
  QRasterizer::setClipRect(pQVar1,&local_18);
  pQVar1 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->(this_01);
  QRasterizer::initialize(pQVar1,blend_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::initializeRasterizer(QSpanData *data)
{
    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    rasterizer->setAntialiased(s->flags.antialiased);

    QRect clipRect(deviceRect);
    ProcessSpans blend;
    // ### get from optimized rectbased QClipData

    const QClipData *c = clip();
    if (c) {
        const QRect r(QPoint(c->xmin, c->ymin),
                      QSize(c->xmax - c->xmin, c->ymax - c->ymin));
        clipRect = clipRect.intersected(r);
        blend = data->blend;
    } else {
        blend = data->unclipped_blend;
    }

    rasterizer->setClipRect(clipRect);
    rasterizer->initialize(blend, data);
}